

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalUndo(Wal *pWal,_func_int_void_ptr_Pgno *xUndo,void *pUndoCtx)

{
  uint uVar1;
  u32 uVar2;
  WalIndexHdr *__src;
  uint local_2c;
  Pgno iFrame;
  Pgno iMax;
  int rc;
  void *pUndoCtx_local;
  _func_int_void_ptr_Pgno *xUndo_local;
  Wal *pWal_local;
  
  iFrame = 0;
  if (pWal->writeLock != '\0') {
    uVar1 = (pWal->hdr).mxFrame;
    __src = walIndexHdr(pWal);
    memcpy(&pWal->hdr,__src,0x30);
    local_2c = (pWal->hdr).mxFrame;
    while (local_2c = local_2c + 1, iFrame == 0 && local_2c <= uVar1) {
      uVar2 = walFramePgno(pWal,local_2c);
      iFrame = (*xUndo)(pUndoCtx,uVar2);
    }
    if (uVar1 != (pWal->hdr).mxFrame) {
      walCleanupHash(pWal);
    }
  }
  return iFrame;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalUndo(Wal *pWal, int (*xUndo)(void *, Pgno), void *pUndoCtx){
  int rc = SQLITE_OK;
  if( ALWAYS(pWal->writeLock) ){
    Pgno iMax = pWal->hdr.mxFrame;
    Pgno iFrame;

    /* Restore the clients cache of the wal-index header to the state it
    ** was in before the client began writing to the database.
    */
    memcpy(&pWal->hdr, (void *)walIndexHdr(pWal), sizeof(WalIndexHdr));

    for(iFrame=pWal->hdr.mxFrame+1;
        ALWAYS(rc==SQLITE_OK) && iFrame<=iMax;
        iFrame++
    ){
      /* This call cannot fail. Unless the page for which the page number
      ** is passed as the second argument is (a) in the cache and
      ** (b) has an outstanding reference, then xUndo is either a no-op
      ** (if (a) is false) or simply expels the page from the cache (if (b)
      ** is false).
      **
      ** If the upper layer is doing a rollback, it is guaranteed that there
      ** are no outstanding references to any page other than page 1. And
      ** page 1 is never written to the log until the transaction is
      ** committed. As a result, the call to xUndo may not fail.
      */
      assert( walFramePgno(pWal, iFrame)!=1 );
      rc = xUndo(pUndoCtx, walFramePgno(pWal, iFrame));
    }
    if( iMax!=pWal->hdr.mxFrame ) walCleanupHash(pWal);
  }
  return rc;
}